

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Promise<void> __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *interfaceName,char *methodName,uint64_t typeId,uint16_t methodId)

{
  PromiseNode *extraout_RDX;
  undefined6 in_register_00000082;
  Promise<void> PVar1;
  unsigned_short *in_stack_fffffffffffffe20;
  String local_1a8;
  Exception local_190;
  undefined1 local_32 [2];
  char *pcStack_30;
  uint16_t methodId_local;
  uint64_t typeId_local;
  char *methodName_local;
  char *interfaceName_local;
  Server *this_local;
  
  pcStack_30 = (char *)CONCAT62(in_register_00000082,methodId);
  typeId_local = typeId;
  methodName_local = methodName;
  interfaceName_local = interfaceName;
  this_local = this;
  kj::_::Debug::
  makeDescription<char_const(&)[24],char_const*&,unsigned_long&,char_const*&,unsigned_short&>
            (&local_1a8,
             (Debug *)"\"Method not implemented.\", interfaceName, typeId, methodName, methodId",
             "Method not implemented.",(char (*) [24])&methodName_local,&stack0xffffffffffffffd0,
             &typeId_local,(char **)local_32,in_stack_fffffffffffffe20);
  kj::Exception::Exception
            (&local_190,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x56,&local_1a8);
  kj::Promise<void>::Promise((Promise<void> *)this,&local_190);
  kj::Exception::~Exception(&local_190);
  kj::String::~String(&local_1a8);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> Capability::Server::internalUnimplemented(
    const char* interfaceName, const char* methodName, uint64_t typeId, uint16_t methodId) {
  return KJ_EXCEPTION(UNIMPLEMENTED, "Method not implemented.", interfaceName,
                      typeId, methodName, methodId);
}